

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigMffc.c
# Opt level: O3

int Aig_NodeMffcLabel(Aig_Man_t *p,Aig_Obj_t *pNode,float *pPower)

{
  int iVar1;
  int iVar2;
  float *pProbs;
  
  if ((p->vProbs == (Vec_Int_t *)0x0) == (pPower != (float *)0x0)) {
    __assert_fail("(pPower != NULL) == (p->vProbs != NULL)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xd6,"int Aig_NodeMffcLabel(Aig_Man_t *, Aig_Obj_t *, float *)");
  }
  if (((ulong)pNode & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xd7,"int Aig_NodeMffcLabel(Aig_Man_t *, Aig_Obj_t *, float *)");
  }
  if ((*(uint *)&pNode->field_0x18 & 7) - 7 < 0xfffffffe) {
    __assert_fail("Aig_ObjIsNode(pNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xd8,"int Aig_NodeMffcLabel(Aig_Man_t *, Aig_Obj_t *, float *)");
  }
  Aig_ManIncrementTravId(p);
  if (p->vProbs == (Vec_Int_t *)0x0) {
    pProbs = (float *)0x0;
  }
  else {
    pProbs = (float *)p->vProbs->pArray;
  }
  iVar1 = Aig_NodeDeref_rec(pNode,0,pPower,pProbs);
  iVar2 = Aig_NodeRefLabel_rec(p,pNode,0);
  if (iVar1 == iVar2) {
    if (0 < iVar1) {
      return iVar1;
    }
    __assert_fail("ConeSize1 > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                  ,0xdd,"int Aig_NodeMffcLabel(Aig_Man_t *, Aig_Obj_t *, float *)");
  }
  __assert_fail("ConeSize1 == ConeSize2",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigMffc.c"
                ,0xdc,"int Aig_NodeMffcLabel(Aig_Man_t *, Aig_Obj_t *, float *)");
}

Assistant:

int Aig_NodeMffcLabel( Aig_Man_t * p, Aig_Obj_t * pNode, float * pPower )
{
    int ConeSize1, ConeSize2;
    assert( (pPower != NULL) == (p->vProbs != NULL) );
    assert( !Aig_IsComplement(pNode) );
    assert( Aig_ObjIsNode(pNode) );
    Aig_ManIncrementTravId( p );
    ConeSize1 = Aig_NodeDeref_rec( pNode, 0, pPower, p->vProbs? (float *)p->vProbs->pArray : NULL );
    ConeSize2 = Aig_NodeRefLabel_rec( p, pNode, 0 );
    assert( ConeSize1 == ConeSize2 );
    assert( ConeSize1 > 0 );
    return ConeSize1;
}